

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.cpp
# Opt level: O0

void equal_range(void)

{
  allocator *this;
  mapped_type *pmVar1;
  key_type local_69;
  pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*> local_68;
  key_type local_57 [15];
  undefined1 local_48 [8];
  pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*> ret;
  undefined1 local_30 [8];
  vector_map<char,_int,_eastl::less<char>,_eastl::allocator> mymap;
  
  this = (allocator *)((long)&ret.second + 6);
  eastl::allocator::allocator(this,"EASTL vector");
  eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::vector_map
            ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
             (key_compare *)((long)&ret.second + 7),this);
  eastl::pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*>::pair
            ((pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*> *)local_48);
  local_57[2] = 0x61;
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_57 + 2);
  *pmVar1 = 10;
  local_57[1] = 0x62;
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_57 + 1);
  *pmVar1 = 0x14;
  local_57[0] = 'c';
  pmVar1 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::operator[]
                     ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                      local_57);
  *pmVar1 = 0x1e;
  local_69 = 'b';
  local_68 = eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::equal_range
                       ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30,
                        &local_69);
  ret.first = local_68.second;
  local_48 = (undefined1  [8])local_68.first;
  if (((pair<char,_int> *)local_48)->first != 'b') {
    __assert_fail("ret.first->first == \'b\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/take-cheeze[P]EASTL/test/vector_map.cpp"
                  ,0x1b0,"void equal_range()");
  }
  if (((pair<char,_int> *)local_48)->second != 0x14) {
    __assert_fail("ret.first->second == 20",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/take-cheeze[P]EASTL/test/vector_map.cpp"
                  ,0x1b1,"void equal_range()");
  }
  if ((ret.first)->first != 'c') {
    __assert_fail("ret.second->first == \'c\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/take-cheeze[P]EASTL/test/vector_map.cpp"
                  ,0x1b3,"void equal_range()");
  }
  if ((ret.first)->second == 0x1e) {
    eastl::vector_map<char,_int,_eastl::less<char>,_eastl::allocator>::~vector_map
              ((vector_map<char,_int,_eastl::less<char>,_eastl::allocator> *)local_30);
    return;
  }
  __assert_fail("ret.second->second == 30",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/take-cheeze[P]EASTL/test/vector_map.cpp"
                ,0x1b4,"void equal_range()");
}

Assistant:

static void equal_range() {
  eastl::vector_map<char, int> mymap;
  eastl::pair<eastl::vector_map<char, int>::iterator,
      eastl::vector_map<char, int>::iterator> ret;

  mymap['a']=10;
  mymap['b']=20;
  mymap['c']=30;

  ret = mymap.equal_range('b');

  assert(ret.first->first == 'b');
  assert(ret.first->second == 20);

  assert(ret.second->first == 'c');
  assert(ret.second->second == 30);
}